

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

string * __thiscall
CppGenerator::genMaxMinValues_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *varOrder)

{
  undefined8 *puVar1;
  pointer puVar2;
  Attribute *pAVar3;
  undefined8 *puVar4;
  long *plVar5;
  long *plVar6;
  CppGenerator *this_00;
  ulong uVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong *local_158;
  long local_150;
  ulong local_148 [2];
  undefined8 *local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  string local_118;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  CppGenerator *local_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_58 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  puVar2 = (varOrder->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((varOrder->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    uVar9 = 0;
    do {
      pAVar3 = TreeDecomposition::getAttribute
                         ((local_58->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          puVar2[uVar9]);
      local_158 = local_148;
      this_00 = (CppGenerator *)0x6;
      std::__cxx11::string::_M_construct((ulong)&local_158,'\x06');
      typeToStr_abi_cxx11_(&local_118,this_00,pAVar3->_type);
      uVar7 = 0xf;
      if (local_158 != local_148) {
        uVar7 = local_148[0];
      }
      if (uVar7 < local_118._M_string_length + local_150) {
        uVar8 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          uVar8 = local_118.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar8 < local_118._M_string_length + local_150) goto LAB_00283e78;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_158);
      }
      else {
LAB_00283e78:
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_158,(ulong)local_118._M_dataplus._M_p);
      }
      puVar1 = puVar4 + 2;
      if ((undefined8 *)*puVar4 == puVar1) {
        local_128 = *puVar1;
        uStack_120 = puVar4[3];
        local_138 = &local_128;
      }
      else {
        local_128 = *puVar1;
        local_138 = (undefined8 *)*puVar4;
      }
      local_130 = puVar4[1];
      *puVar4 = puVar1;
      puVar4[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_138);
      local_f8 = &local_e8;
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_e8 = *plVar6;
        lStack_e0 = plVar5[3];
      }
      else {
        local_e8 = *plVar6;
        local_f8 = (long *)*plVar5;
      }
      local_f0 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_f8,(ulong)(pAVar3->_name)._M_dataplus._M_p);
      local_d8 = &local_c8;
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_c8 = *plVar6;
        lStack_c0 = plVar5[3];
      }
      else {
        local_c8 = *plVar6;
        local_d8 = (long *)*plVar5;
      }
      local_d0 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_b8 = &local_a8;
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_a8 = *plVar6;
        lStack_a0 = plVar5[3];
      }
      else {
        local_a8 = *plVar6;
        local_b8 = (long *)*plVar5;
      }
      local_b0 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
      local_98 = &local_88;
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_88 = *plVar6;
        lStack_80 = plVar5[3];
      }
      else {
        local_88 = *plVar6;
        local_98 = (long *)*plVar5;
      }
      local_90 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_98,(ulong)(pAVar3->_name)._M_dataplus._M_p);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_40 = *plVar6;
        lStack_38 = plVar5[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar6;
        local_50 = (long *)*plVar5;
      }
      local_48 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_68 = *plVar6;
        lStack_60 = plVar5[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar6;
        local_78 = (long *)*plVar5;
      }
      local_70 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if (local_158 != local_148) {
        operator_delete(local_158);
      }
      uVar9 = uVar9 + 1;
      puVar2 = (varOrder->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(varOrder->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3))
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::genMaxMinValues(const std::vector<size_t>& varOrder)
{
    std::string returnString = "";
    for (size_t var = 0; var < varOrder.size(); ++var)
    {
        Attribute* attr = _td->getAttribute(varOrder[var]);
        returnString += offset(2)+typeToStr(attr->_type)+" min_"+attr->_name+", "+
            "max_"+attr->_name+";\n";
    }
    return returnString;
}